

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

Own<kj::_::AttachmentPromiseNode<kj::Array<unsigned_char>_>,_kj::_::PromiseDisposer> __thiscall
kj::_::PromiseDisposer::
appendPromise<kj::_::AttachmentPromiseNode<kj::Array<unsigned_char>>,kj::_::PromiseDisposer,kj::Array<unsigned_char>>
          (PromiseDisposer *this,OwnPromiseNode *next,Array<unsigned_char> *params)

{
  PromiseArena *pPVar1;
  PromiseNode *pPVar2;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *pOVar3;
  Array<unsigned_char> *pAVar4;
  AttachmentPromiseNode<kj::Array<unsigned_char>_> *ptr;
  PromiseArena *arena;
  Array<unsigned_char> *params_local;
  OwnPromiseNode *next_local;
  
  pPVar2 = Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator->(next);
  pPVar1 = (pPVar2->super_PromiseArenaMember).arena;
  if ((pPVar1 == (PromiseArena *)0x0) ||
     (pPVar2 = Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::get(next),
     (ulong)((long)pPVar2 - (long)pPVar1) < 0x30)) {
    pOVar3 = mv<kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>>(next);
    pAVar4 = fwd<kj::Array<unsigned_char>>(params);
    alloc<kj::_::AttachmentPromiseNode<kj::Array<unsigned_char>>,kj::_::PromiseDisposer,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::Array<unsigned_char>>
              (this,pOVar3,pAVar4);
  }
  else {
    pPVar2 = Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator->(next);
    (pPVar2->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    pPVar2 = Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::get(next);
    pOVar3 = mv<kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>>(next);
    pAVar4 = fwd<kj::Array<unsigned_char>>(params);
    ctor<kj::_::AttachmentPromiseNode<kj::Array<unsigned_char>>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::Array<unsigned_char>>
              ((AttachmentPromiseNode<kj::Array<unsigned_char>_> *)(pPVar2 + -3),pOVar3,pAVar4);
    pPVar2[-3].super_PromiseArenaMember.arena = pPVar1;
    Own<kj::_::AttachmentPromiseNode<kj::Array<unsigned_char>_>,_kj::_::PromiseDisposer>::Own
              ((Own<kj::_::AttachmentPromiseNode<kj::Array<unsigned_char>_>,_kj::_::PromiseDisposer>
                *)this,(AttachmentPromiseNode<kj::Array<unsigned_char>_> *)(pPVar2 + -3));
  }
  return (Own<kj::_::AttachmentPromiseNode<kj::Array<unsigned_char>_>,_kj::_::PromiseDisposer>)
         (AttachmentPromiseNode<kj::Array<unsigned_char>_> *)this;
}

Assistant:

static kj::Own<T, D> appendPromise(
      OwnPromiseNode&& next, Params&&... params) noexcept {
    // Append a promise to the arena that currently ends with `next`. `next` is also still passed as
    // the first parameter to the new object's constructor.
    //
    // This is semantically the same as `allocPromise()` except that it may avoid the underlying
    // memory allocation. `next` must end up being destroyed before the new object (i.e. the new
    // object must never transfer away ownership of `next`).


    PromiseArena* arena = next->arena;

    if (!canArenaAllocate<T>() || arena == nullptr ||
        reinterpret_cast<byte*>(next.get()) - reinterpret_cast<byte*>(arena) < sizeof(T)) {
      // No arena available, or not enough space, or weird alignment needed. Start new arena.
      return alloc<T, D>(kj::mv(next), kj::fwd<Params>(params)...);
    } else {
      // Append to arena.
      //
      // NOTE: When we call ctor(), it takes ownership of `next`, so we shouldn't assume `next`
      //   still exists after it returns. So we have to remove ownership of the arena before that.
      //   In theory if we wanted this to be exception-safe, we'd also have to arrange to delete
      //   the arena if the constructor throws. However, in practice none of the PromiseNode
      //   constructors throw, so we just mark the whole method noexcept in order to avoid the
      //   code bloat to handle this case.
      next->arena = nullptr;
      T* ptr = reinterpret_cast<T*>(next.get()) - 1;
      ctor(*ptr, kj::mv(next), kj::fwd<Params>(params)...);
      ptr->arena = arena;
      KJ_IREQUIRE(reinterpret_cast<void*>(ptr) ==
                  reinterpret_cast<void*>(static_cast<PromiseArenaMember*>(ptr)),
          "PromiseArenaMember must be the leftmost inherited type.");
      return kj::Own<T, D>(ptr);
    }
  }